

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O0

batch __thiscall
ear::PolarExtentCoreSimd<xsimd::sse2>::weight_stadium
          (PolarExtentCoreSimd<xsimd::sse2> *this,PolarExtentCoreContext *ctx,
          PositionBatch<xsimd::batch<float,_xsimd::sse2>_> *position)

{
  undefined1 auVar1 [16];
  bool bVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  float extraout_XMM0_Dd_04;
  float extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  float extraout_XMM0_Dd_07;
  undefined8 uVar3;
  batch<float,_xsimd::sse2> bVar4;
  batch_bool<float,_xsimd::sse2> bVar5;
  batch bVar6;
  undefined1 auStack_178 [8];
  batch circle_val;
  batch<float,_xsimd::sse2> local_158;
  batch<float,_xsimd::sse2> local_148;
  undefined1 auStack_138 [8];
  batch<float,_xsimd::sse2> circle_dot;
  undefined1 auStack_118 [8];
  batch straight_val;
  undefined1 auStack_f8 [8];
  batch_bool<float,_xsimd::sse2> in_straight_line_part;
  batch<float,_xsimd::sse2> local_d8;
  batch<float,_xsimd::sse2> local_c8;
  undefined1 auStack_b8 [8];
  batch<float,_xsimd::sse2> circle_test_dot;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [8];
  PositionBatch<xsimd::batch<float,_xsimd::sse2>_> position_t_right;
  PositionBatch<xsimd::batch<float,_xsimd::sse2>_> position_t;
  PositionBatch<xsimd::batch<float,_xsimd::sse2>_> *position_local;
  PolarExtentCoreContext *ctx_local;
  PolarExtentCoreSimd<xsimd::sse2> *this_local;
  
  PositionBatch<xsimd::batch<float,_xsimd::sse2>_>::transform
            ((PositionBatch<xsimd::batch<float,_xsimd::sse2>_> *)
             (position_t_right.z.super_simd_register<float,_xsimd::sse2>.data + 2),position,
             ctx->flippedBasis);
  memcpy(local_98,position_t_right.z.super_simd_register<float,_xsimd::sse2>.data + 2,0x30);
  bVar4 = xsimd::abs<float,xsimd::sse2>
                    ((batch<float,_xsimd::sse2> *)
                     (position_t_right.z.super_simd_register<float,_xsimd::sse2>.data + 2));
  local_98 = bVar4.super_simd_register<float,_xsimd::sse2>.data._0_8_;
  auVar1._8_4_ = extraout_XMM0_Dc;
  auVar1._0_4_ = local_98._0_4_;
  auVar1._4_4_ = local_98._4_4_;
  auVar1._12_4_ = extraout_XMM0_Dd;
  _fStack_a0 = auVar1._8_8_;
  position_t_right.x.super_simd_register<float,_xsimd::sse2>.data[0] = fStack_a0;
  position_t_right.x.super_simd_register<float,_xsimd::sse2>.data[1] = fStack_9c;
  unique0x1000078b = auVar1;
  xsimd::batch<float,_xsimd::sse2>::batch(&local_c8,ctx->circle_test[0]);
  xsimd::batch<float,_xsimd::sse2>::batch
            ((batch<float,_xsimd::sse2> *)
             (in_straight_line_part.super_get_bool_simd_register_t<float,_xsimd::sse2>.data + 2),
             ctx->circle_test[1]);
  bVar4 = xsimd::operator*((batch<float,_xsimd::sse2> *)
                           (position_t_right.x.super_simd_register<float,_xsimd::sse2>.data + 2),
                           (batch<float,_xsimd::sse2> *)
                           (in_straight_line_part.super_get_bool_simd_register_t<float,_xsimd::sse2>
                            .data + 2));
  local_d8.super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_00;
  local_d8.super_simd_register<float,_xsimd::sse2>.data[0] =
       (float)(int)bVar4.super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_d8.super_simd_register<float,_xsimd::sse2>.data[1] =
       (float)(int)((ulong)bVar4.super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  local_d8.super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_00;
  bVar4 = xsimd::fma<float,xsimd::sse2>((batch<float,_xsimd::sse2> *)local_98,&local_c8,&local_d8);
  unique0x10000113 = (float)extraout_XMM0_Dc_01;
  auStack_b8._0_4_ = (float)(int)bVar4.super_simd_register<float,_xsimd::sse2>.data._0_8_;
  auStack_b8._4_4_ =
       (float)(int)((ulong)bVar4.super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  unique0x10000117 = extraout_XMM0_Dd_01;
  xsimd::batch<float,_xsimd::sse2>::batch
            ((batch<float,_xsimd::sse2> *)
             (straight_val.super_simd_register<float,_xsimd::sse2>.data + 2),0.0);
  bVar5 = xsimd::operator>=((batch<float,_xsimd::sse2> *)auStack_b8,
                            (batch<float,_xsimd::sse2> *)
                            (straight_val.super_simd_register<float,_xsimd::sse2>.data + 2));
  unique0x10000137 = (float)extraout_XMM0_Dc_02;
  auStack_f8._0_4_ = (float)(int)bVar5.super_get_bool_simd_register_t<float,_xsimd::sse2>.data._0_8_
  ;
  auStack_f8._4_4_ =
       (float)(int)((ulong)bVar5.super_get_bool_simd_register_t<float,_xsimd::sse2>.data._0_8_ >>
                   0x20);
  unique0x1000013b = extraout_XMM0_Dd_02;
  bVar4 = xsimd::abs<float,xsimd::sse2>
                    ((batch<float,_xsimd::sse2> *)
                     (position_t.y.super_simd_register<float,_xsimd::sse2>.data + 2));
  unique0x1000015b = extraout_XMM0_Dc_03;
  circle_dot.super_simd_register<float,_xsimd::sse2>.data._8_8_ =
       bVar4.super_simd_register<float,_xsimd::sse2>.data._0_8_;
  unique0x1000015f = extraout_XMM0_Dd_03;
  bVar6 = weight_from_sin(this,ctx,(batch)bVar4.super_simd_register<float,_xsimd::sse2>.data);
  unique0x1000017f = (float)extraout_XMM0_Dc_04;
  auStack_118._0_4_ = (float)(int)bVar6.super_simd_register<float,_xsimd::sse2>.data._0_8_;
  auStack_118._4_4_ =
       (float)(int)((ulong)bVar6.super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  unique0x10000183 = extraout_XMM0_Dd_04;
  xsimd::batch<float,_xsimd::sse2>::batch(&local_148,ctx->right_circle_centre[0]);
  xsimd::batch<float,_xsimd::sse2>::batch
            ((batch<float,_xsimd::sse2> *)
             (circle_val.super_simd_register<float,_xsimd::sse2>.data + 2),
             ctx->right_circle_centre[1]);
  bVar4 = xsimd::operator*((batch<float,_xsimd::sse2> *)
                           (position_t_right.x.super_simd_register<float,_xsimd::sse2>.data + 2),
                           (batch<float,_xsimd::sse2> *)
                           (circle_val.super_simd_register<float,_xsimd::sse2>.data + 2));
  local_158.super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_05;
  local_158.super_simd_register<float,_xsimd::sse2>.data[0] =
       (float)(int)bVar4.super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_158.super_simd_register<float,_xsimd::sse2>.data[1] =
       (float)(int)((ulong)bVar4.super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  local_158.super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_05;
  bVar4 = xsimd::fma<float,xsimd::sse2>((batch<float,_xsimd::sse2> *)local_98,&local_148,&local_158)
  ;
  unique0x100001c7 = extraout_XMM0_Dc_06;
  auStack_138 = bVar4.super_simd_register<float,_xsimd::sse2>.data._0_8_;
  unique0x100001cb = extraout_XMM0_Dd_06;
  bVar6 = weight_from_cos(this,ctx,(batch)bVar4.super_simd_register<float,_xsimd::sse2>.data);
  uVar3 = bVar6.super_simd_register<float,_xsimd::sse2>.data._8_8_;
  unique0x100001eb = (float)extraout_XMM0_Dc_07;
  auStack_178._0_4_ = (float)(int)bVar6.super_simd_register<float,_xsimd::sse2>.data._0_8_;
  auStack_178._4_4_ =
       (float)(int)((ulong)bVar6.super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  unique0x100001ef = extraout_XMM0_Dd_07;
  bVar2 = xsimd::all<float,xsimd::sse2>((batch_bool<float,_xsimd::sse2> *)auStack_f8);
  if (bVar2) {
    this_local = (PolarExtentCoreSimd<xsimd::sse2> *)auStack_118;
  }
  else {
    bVar2 = xsimd::none<float,xsimd::sse2>((batch_bool<float,_xsimd::sse2> *)auStack_f8);
    if (bVar2) {
      this_local = (PolarExtentCoreSimd<xsimd::sse2> *)auStack_178;
    }
    else {
      bVar4 = xsimd::select<float,xsimd::sse2>
                        ((batch_bool<float,_xsimd::sse2> *)auStack_f8,
                         (batch<float,_xsimd::sse2> *)auStack_118,
                         (batch<float,_xsimd::sse2> *)auStack_178);
      uVar3 = bVar4.super_simd_register<float,_xsimd::sse2>.data._8_8_;
      this_local = bVar4.super_simd_register<float,_xsimd::sse2>.data._0_8_;
    }
  }
  bVar6.super_simd_register<float,_xsimd::sse2>.data[2] = (float)(int)uVar3;
  bVar6.super_simd_register<float,_xsimd::sse2>.data[3] = (float)(int)((ulong)uVar3 >> 0x20);
  bVar6.super_simd_register<float,_xsimd::sse2>.data._0_8_ = this_local;
  return (batch)bVar6.super_simd_register<float,_xsimd::sse2>.data;
}

Assistant:

batch weight_stadium(PolarExtentCoreContext &ctx,
                         const PositionBatch<batch> &position) const {
      PositionBatch<batch> position_t = position.transform(ctx.flippedBasis);

      PositionBatch<batch> position_t_right = position_t;
      position_t_right.x = xsimd::abs(position_t.x);

      auto circle_test_dot =
          xsimd::fma(position_t_right.x, batch{ctx.circle_test[0]},
                     position_t_right.y * batch{ctx.circle_test[1]});
      auto in_straight_line_part = circle_test_dot >= batch{0.0};

      // for the straight line part
      auto straight_val = weight_from_sin(ctx, xsimd::abs(position_t.z));

      // for the circle part
      auto circle_dot =
          xsimd::fma(position_t_right.x, batch{ctx.right_circle_centre[0]},
                     position_t_right.y * batch{ctx.right_circle_centre[1]});
      auto circle_val = weight_from_cos(ctx, circle_dot);

      if (xsimd::all(in_straight_line_part))
        return straight_val;
      else if (xsimd::none(in_straight_line_part))
        return circle_val;
      else
        return xsimd::select(in_straight_line_part, straight_val, circle_val);
    }